

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomFragmentOpTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::RandomFragmentOpCase::init(RandomFragmentOpCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  RenderTarget *pRVar2;
  QuadRenderer *this_00;
  TextureLevel *pTVar3;
  ReferenceQuadRenderer *this_01;
  int width;
  int height;
  TextureFormat local_30;
  
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  width = pRVar2->m_width;
  if (0x3f < width) {
    width = 0x40;
  }
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  height = 0x40;
  if (pRVar2->m_height < 0x40) {
    height = pRVar2->m_height;
  }
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = (pRVar2->m_pixelFormat).alphaBits;
  this_00 = (QuadRenderer *)operator_new(0x20);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,GLSL_VERSION_100_ES);
  this->m_renderer = this_00;
  pTVar3 = (TextureLevel *)operator_new(0x28);
  local_30.type = UNORM_INT8;
  local_30.order = RGBA - (iVar1 == 0);
  tcu::TextureLevel::TextureLevel(pTVar3,&local_30,width,height,1);
  this->m_refColorBuffer = pTVar3;
  pTVar3 = (TextureLevel *)operator_new(0x28);
  local_30.order = D;
  local_30.type = FLOAT;
  tcu::TextureLevel::TextureLevel(pTVar3,&local_30,width,height,1);
  this->m_refDepthBuffer = pTVar3;
  pTVar3 = (TextureLevel *)operator_new(0x28);
  local_30.order = S;
  local_30.type = UNSIGNED_INT32;
  tcu::TextureLevel::TextureLevel(pTVar3,&local_30,width,height,1);
  this->m_refStencilBuffer = pTVar3;
  this_01 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_01);
  this->m_refRenderer = this_01;
  this->m_iterNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void RandomFragmentOpCase::init (void)
{
	DE_ASSERT(!m_renderer && !m_refColorBuffer && !m_refDepthBuffer && !m_refStencilBuffer && !m_refRenderer);

	int		width	= de::min<int>(m_context.getRenderTarget().getWidth(), VIEWPORT_WIDTH);
	int		height	= de::min<int>(m_context.getRenderTarget().getHeight(), VIEWPORT_HEIGHT);
	bool	useRGB	= m_context.getRenderTarget().getPixelFormat().alphaBits == 0;

	m_renderer			= new gls::FragmentOpUtil::QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_100_ES);
	m_refColorBuffer	= new tcu::TextureLevel(tcu::TextureFormat(useRGB ? tcu::TextureFormat::RGB : tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height);
	m_refDepthBuffer	= new tcu::TextureLevel(tcu::TextureFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT),			width, height);
	m_refStencilBuffer	= new tcu::TextureLevel(tcu::TextureFormat(tcu::TextureFormat::S, tcu::TextureFormat::UNSIGNED_INT32),	width, height);
	m_refRenderer		= new gls::FragmentOpUtil::ReferenceQuadRenderer();
	m_iterNdx			= 0;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}